

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_exit_example.cpp
# Opt level: O1

void foo2(int *a)

{
  long *plVar1;
  runtime_error *this;
  
  *a = 2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"foo2 a = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*a);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void foo2(int& a) {
  SAVER_EXIT(a); // State saver on exit.

  a = 2;
  std::cout << "foo2 a = " << a << std::endl;
  throw std::runtime_error{"error"};
  // Original state will automatically restored, on error.
}